

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void BrotliEncodeMlen(size_t length,uint64_t *bits,size_t *numbits,uint64_t *nibblesbits)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char *__assertion;
  
  if (length != 1) {
    if (length == 0) {
      __assertion = "length > 0";
      uVar2 = 0x5c;
LAB_00117ccb:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                    ,uVar2,"void BrotliEncodeMlen(size_t, uint64_t *, size_t *, uint64_t *)");
    }
    if (0x1000000 < length) {
      __assertion = "length <= (1 << 24)";
      uVar2 = 0x5d;
      goto LAB_00117ccb;
    }
    uVar2 = (int)length - 1;
    if (0xffffff < uVar2) {
      __assertion = "lg <= 24";
      uVar2 = 0x5e;
      goto LAB_00117ccb;
    }
    if (0x7fff < uVar2) {
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar3 = (ulong)(0x23 - (uVar1 ^ 0x1f) >> 2);
      goto LAB_00117c6d;
    }
  }
  uVar3 = 4;
LAB_00117c6d:
  *nibblesbits = uVar3 - 4;
  *numbits = (ulong)(uint)((int)uVar3 << 2);
  *bits = length - 1;
  return;
}

Assistant:

static void BrotliEncodeMlen(size_t length, uint64_t* bits,
                             size_t* numbits, uint64_t* nibblesbits) {
  size_t lg = (length == 1) ? 1 : Log2FloorNonZero((uint32_t)(length - 1)) + 1;
  size_t mnibbles = (lg < 16 ? 16 : (lg + 3)) / 4;
  assert(length > 0);
  assert(length <= (1 << 24));
  assert(lg <= 24);
  *nibblesbits = mnibbles - 4;
  *numbits = mnibbles * 4;
  *bits = length - 1;
}